

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

void tcu::astc::generateDummyNormalBlocks
               (deUint8 *dst,size_t numBlocks,int blockWidth,int blockHeight)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  deUint8 *pdVar4;
  NormalBlockISEInputs *iseInputs_00;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  deUint8 *pdVar9;
  NormalBlockISEInputs *pNVar10;
  bool bVar11;
  AssignBlock128 AVar12;
  NormalBlockParams blockParams;
  NormalBlockISEInputs iseInputs;
  Word local_c80 [2];
  NormalBlockParams local_c6c;
  NormalBlockISEInputs local_c38;
  
  local_c6c.ccs = 0xffffffff;
  local_c6c.numPartitions = 1;
  local_c6c.isMultiPartSingleCemMode = false;
  local_c6c.partitionSeed = 0xffffffff;
  local_c6c.colorEndpointModes[2] = 0;
  local_c6c.colorEndpointModes[3] = 0;
  local_c6c.weightGridWidth = 3;
  local_c6c.weightGridHeight = 3;
  local_c6c.weightISEParams.mode = ISEMODE_PLAIN_BIT;
  local_c6c.weightISEParams.numBits = 5;
  local_c6c.isDualPlane = false;
  local_c6c.colorEndpointModes[0] = 8;
  local_c6c.colorEndpointModes[1] = 0;
  anon_unknown_0::generateDefaultISEInputs(&local_c38,&local_c6c);
  local_c38.weight.isGivenInBlockForm = false;
  if (local_c6c.weightISEParams.mode == ISEMODE_PLAIN_BIT) {
    uVar3 = ~(-1 << ((byte)local_c6c.weightISEParams.numBits & 0x1f));
  }
  else {
    if (local_c6c.weightISEParams.mode == ISEMODE_QUINT) {
      iVar2 = 5;
    }
    else {
      uVar3 = 0xffffffff;
      if (local_c6c.weightISEParams.mode != ISEMODE_TRIT) goto LAB_00931a7b;
      iVar2 = 3;
    }
    uVar3 = (iVar2 << ((byte)local_c6c.weightISEParams.numBits & 0x1f)) - 1;
  }
LAB_00931a7b:
  if (numBlocks != 0) {
    uVar7 = numBlocks * 9 - 1;
    pNVar10 = (NormalBlockISEInputs *)0x0;
    sVar6 = 0;
    do {
      lVar8 = 1;
      iseInputs_00 = pNVar10;
      do {
        uVar1 = (ulong)iseInputs_00 % uVar7;
        *(int *)(&local_c38.weight.isGivenInBlockForm + lVar8 * 4) =
             (int)((ulong)iseInputs_00 / uVar7);
        iseInputs_00 = (NormalBlockISEInputs *)
                       (&(iseInputs_00->weight).isGivenInBlockForm + (int)uVar3);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 10);
      AVar12 = anon_unknown_0::generateNormalBlock
                         (&local_c6c,(int)&local_c38,(int)uVar1,iseInputs_00);
      local_c80[0] = AVar12.m_words[0];
      local_c80[1] = AVar12.m_words[1];
      pdVar4 = dst;
      lVar8 = 0;
      do {
        uVar1 = local_c80[lVar8];
        lVar5 = 0;
        pdVar9 = pdVar4;
        do {
          *pdVar9 = (deUint8)(uVar1 >> ((byte)lVar5 & 0x3f));
          pdVar9 = pdVar9 + 1;
          lVar5 = lVar5 + 8;
        } while (lVar5 != 0x40);
        pdVar4 = pdVar4 + 8;
        bVar11 = lVar8 == 0;
        lVar8 = lVar8 + 1;
      } while (bVar11);
      sVar6 = sVar6 + 1;
      pNVar10 = (NormalBlockISEInputs *)
                (&(pNVar10->weight).isGivenInBlockForm + (long)(int)uVar3 * 9);
      dst = dst + 0x10;
    } while (sVar6 != numBlocks);
  }
  return;
}

Assistant:

void generateDummyNormalBlocks (deUint8* dst, size_t numBlocks, int blockWidth, int blockHeight)
{
	NormalBlockParams blockParams;

	blockParams.weightGridWidth			= 3;
	blockParams.weightGridHeight		= 3;
	blockParams.weightISEParams			= ISEParams(ISEMODE_PLAIN_BIT, 5);
	blockParams.isDualPlane				= false;
	blockParams.numPartitions			= 1;
	blockParams.colorEndpointModes[0]	= 8;

	NormalBlockISEInputs iseInputs = generateDefaultISEInputs(blockParams);
	iseInputs.weight.isGivenInBlockForm = false;

	const int numWeights		= computeNumWeights(blockParams);
	const int weightRangeMax	= computeISERangeMax(blockParams.weightISEParams);

	for (size_t blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		for (int weightNdx = 0; weightNdx < numWeights; weightNdx++)
			iseInputs.weight.value.plain[weightNdx] = (deUint32)((blockNdx*numWeights + weightNdx) * weightRangeMax / (numBlocks*numWeights-1));

		generateNormalBlock(blockParams, blockWidth, blockHeight, iseInputs).assignToMemory(dst + blockNdx*BLOCK_SIZE_BYTES);
	}
}